

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildDescription.cpp
# Opt level: O2

Node * __thiscall
llbuild::buildsystem::BuildDescription::addNode
          (BuildDescription *this,
          unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>
          *value)

{
  Node *pNVar1;
  StringRef Key;
  __uniq_ptr_impl<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>
  *this_00;
  
  pNVar1 = (value->_M_t).
           super___uniq_ptr_impl<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>
           ._M_t.
           super__Tuple_impl<0UL,_llbuild::buildsystem::Node_*,_std::default_delete<llbuild::buildsystem::Node>_>
           .super__Head_base<0UL,_llbuild::buildsystem::Node_*,_false>._M_head_impl;
  Key.Data = (pNVar1->name)._M_dataplus._M_p;
  Key.Length = (pNVar1->name)._M_string_length;
  this_00 = (__uniq_ptr_impl<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>
             *)llvm::
               StringMap<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>,_llvm::MallocAllocator>
               ::operator[](&this->nodes,Key);
  std::__uniq_ptr_impl<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>
  ::operator=(this_00,(__uniq_ptr_impl<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>
                       *)value);
  return pNVar1;
}

Assistant:

Node& BuildDescription::addNode(std::unique_ptr<Node> value) {
  auto& result = *value.get();
  getNodes()[value->getName()] = std::move(value);
  return result;
}